

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O1

void __thiscall CoreML::Specification::Optimizer::MergeFrom(Optimizer *this,Optimizer *from)

{
  void *pvVar1;
  LogMessage *other;
  AdamOptimizer *pAVar2;
  SGDOptimizer *pSVar3;
  AdamOptimizer *from_00;
  SGDOptimizer *from_01;
  LogFinisher local_51;
  LogMessage local_50;
  
  if (from == this) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/build_O1/mlmodel/format/NeuralNetwork.pb.cc"
               ,0x122bb);
    other = google::protobuf::internal::LogMessage::operator<<
                      (&local_50,"CHECK failed: (&from) != (this): ");
    google::protobuf::internal::LogFinisher::operator=(&local_51,other);
    google::protobuf::internal::LogMessage::~LogMessage(&local_50);
  }
  pvVar1 = (from->_internal_metadata_).
           super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
           .ptr_;
  if (((ulong)pvVar1 & 1) != 0) {
    google::protobuf::internal::InternalMetadataWithArenaLite::DoMergeFrom
              (&this->_internal_metadata_,(string *)((ulong)pvVar1 & 0xfffffffffffffffe));
  }
  if (from->_oneof_case_[0] == 10) {
    if (this->_oneof_case_[0] != 10) {
      clear_OptimizerType(this);
      this->_oneof_case_[0] = 10;
      pSVar3 = (SGDOptimizer *)operator_new(0x30);
      SGDOptimizer::SGDOptimizer(pSVar3);
      (this->OptimizerType_).sgdoptimizer_ = pSVar3;
    }
    pSVar3 = (this->OptimizerType_).sgdoptimizer_;
    if (from->_oneof_case_[0] == 10) {
      from_01 = (from->OptimizerType_).sgdoptimizer_;
    }
    else {
      protobuf_NeuralNetwork_2eproto::InitDefaults();
      from_01 = (SGDOptimizer *)&_SGDOptimizer_default_instance_;
    }
    SGDOptimizer::MergeFrom(pSVar3,from_01);
  }
  else if (from->_oneof_case_[0] == 0xb) {
    if (this->_oneof_case_[0] != 0xb) {
      clear_OptimizerType(this);
      this->_oneof_case_[0] = 0xb;
      pAVar2 = (AdamOptimizer *)operator_new(0x40);
      AdamOptimizer::AdamOptimizer(pAVar2);
      (this->OptimizerType_).adamoptimizer_ = pAVar2;
    }
    pAVar2 = (this->OptimizerType_).adamoptimizer_;
    if (from->_oneof_case_[0] == 0xb) {
      from_00 = (from->OptimizerType_).adamoptimizer_;
    }
    else {
      protobuf_NeuralNetwork_2eproto::InitDefaults();
      from_00 = (AdamOptimizer *)&_AdamOptimizer_default_instance_;
    }
    AdamOptimizer::MergeFrom(pAVar2,from_00);
  }
  return;
}

Assistant:

void Optimizer::MergeFrom(const Optimizer& from) {
// @@protoc_insertion_point(class_specific_merge_from_start:CoreML.Specification.Optimizer)
  GOOGLE_DCHECK_NE(&from, this);
  _internal_metadata_.MergeFrom(from._internal_metadata_);
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  switch (from.OptimizerType_case()) {
    case kSgdOptimizer: {
      mutable_sgdoptimizer()->::CoreML::Specification::SGDOptimizer::MergeFrom(from.sgdoptimizer());
      break;
    }
    case kAdamOptimizer: {
      mutable_adamoptimizer()->::CoreML::Specification::AdamOptimizer::MergeFrom(from.adamoptimizer());
      break;
    }
    case OPTIMIZERTYPE_NOT_SET: {
      break;
    }
  }
}